

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_tcp_conn.c
# Opt level: O3

void uo_tcp_conn_before_recv(uo_cb *cb)

{
  int rfd;
  void *pvVar1;
  ptrdiff_t pVar2;
  uo_buf buf;
  uchar *buf_00;
  size_t len;
  
  pvVar1 = uo_cb_stack_index(cb,0);
  buf = *(uo_buf *)((long)pvVar1 + 0x40);
  pVar2 = uo_buf_get_len_after_ptr(buf);
  if (pVar2 == 0) {
    buf = uo_buf_realloc_2x(buf);
    *(uo_buf *)((long)pvVar1 + 0x40) = buf;
  }
  uo_cb_prepend_func(cb,uo_tcp_conn_recv);
  rfd = *(int *)((long)pvVar1 + 0x60);
  buf_00 = uo_buf_get_ptr(buf);
  len = uo_buf_get_len_after_ptr(buf);
  uo_io_read_async(rfd,buf_00,len,cb);
  return;
}

Assistant:

static void uo_tcp_conn_before_recv(
    uo_cb *cb)
{
    uo_tcp_conn *tcp_conn = uo_cb_stack_index(cb, 0);

    uo_buf rbuf = tcp_conn->rbuf;

    if (!uo_buf_get_len_after_ptr(rbuf))
        rbuf = tcp_conn->rbuf = uo_buf_realloc_2x(rbuf);

    uo_cb_prepend(cb, uo_tcp_conn_recv);

    uo_io_read_async(
        tcp_conn->sockfd,
        uo_buf_get_ptr(rbuf),
        uo_buf_get_len_after_ptr(rbuf),
        cb);
}